

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPhysicalDeviceRobustness2FeaturesEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericStringRef<char> local_70;
  GenericStringRef<char> local_60;
  GenericStringRef<char> local_50;
  GenericStringRef<char> local_40;
  undefined1 local_30 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPhysicalDeviceRobustness2FeaturesEXT *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_40,(char (*) [6])0x62c3c2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_40,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<20u>
            (&local_50,(char (*) [20])"robustBufferAccess2");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_50,create_info->robustBufferAccess2,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<19u>
            (&local_60,(char (*) [19])"robustImageAccess2");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_60,create_info->robustImageAccess2,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<15u>
            (&local_70,(char (*) [15])"nullDescriptor");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_70,create_info->nullDescriptor,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_30);
  return true;
}

Assistant:

static bool json_value(const VkPhysicalDeviceRobustness2FeaturesEXT &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("robustBufferAccess2", uint32_t(create_info.robustBufferAccess2), alloc);
	value.AddMember("robustImageAccess2", uint32_t(create_info.robustImageAccess2), alloc);
	value.AddMember("nullDescriptor", uint32_t(create_info.nullDescriptor), alloc);
	*out_value = value;
	return true;
}